

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVextract_attr_list_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CManager_conflict cm_00;
  CMFormat format;
  void *__ptr;
  CMConnection in_RDX;
  CMFormat f;
  attr_list ret;
  EVextract_attr_list_request *request;
  EV_string_response response;
  undefined4 in_stack_ffffffffffffffa8;
  EVstone in_stack_ffffffffffffffac;
  CManager_conflict in_stack_ffffffffffffffb0;
  CManager in_stack_ffffffffffffffb8;
  
  cm_00 = (CManager_conflict)
          CMlookup_format(in_stack_ffffffffffffffb0,
                          (FMStructDescList)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (cm_00 == (CManager_conflict)0x0) {
    cm_00 = (CManager_conflict)
            INT_CMregister_format(in_stack_ffffffffffffffb8,(FMStructDescList)0x0);
  }
  format = (CMFormat)EVextract_attr_list(cm_00,in_stack_ffffffffffffffac);
  __ptr = (void *)attr_list_to_string(format);
  CMwrite(in_RDX,format,cm_00);
  free(__ptr);
  return;
}

Assistant:

static void
REVextract_attr_list_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_string_response response;
    EVextract_attr_list_request *request = (EVextract_attr_list_request *) data;
    attr_list ret;
    CMFormat f = CMlookup_format(conn->cm, EV_string_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_string_response_formats);
    }
    ret = EVextract_attr_list(cm, request->stone_id);
    response.ret = attr_list_to_string(ret);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
    free(response.ret);
}